

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Id __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::createInvocationsOperation
          (TGlslangToSpvTraverser *this,TOperator op,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,TBasicType typeProxy)

{
  Builder *this_00;
  uint uVar1;
  uint uVar2;
  SpvBuildLogger *this_01;
  bool bVar3;
  Id IVar4;
  Op OVar5;
  Capability cap;
  Op opCode;
  uint uVar6;
  pointer puVar7;
  GroupOperation local_98;
  IdImmediate groupOp;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> spvGroupOperands;
  IdImmediate scope;
  
  spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = op - EOpBallot;
  if (uVar1 < 3) {
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    cap = CapabilitySubgroupBallotKHR;
LAB_003c4b20:
    spv::Builder::addCapability(&this->builder,cap);
    local_98 = GroupOperationMax;
    goto LAB_003c4b2c;
  }
  this_00 = &this->builder;
  if (op - EOpAnyInvocation < 3) {
    spv::Builder::addExtension(this_00,"SPV_KHR_subgroup_vote");
    cap = CapabilitySubgroupVoteKHR;
    goto LAB_003c4b20;
  }
  spv::Builder::addCapability(this_00,CapabilityGroups);
  switch(op) {
  case EOpMinInvocationsNonUniform:
  case EOpMaxInvocationsNonUniform:
  case EOpAddInvocationsNonUniform:
  case EOpMinInvocationsInclusiveScanNonUniform:
  case EOpMaxInvocationsInclusiveScanNonUniform:
  case EOpAddInvocationsInclusiveScanNonUniform:
  case EOpMinInvocationsExclusiveScanNonUniform:
  case EOpMaxInvocationsExclusiveScanNonUniform:
  case EOpAddInvocationsExclusiveScanNonUniform:
    spv::Builder::addExtension(this_00,"SPV_AMD_shader_ballot");
    if ((0x1f8U >> (op - EOpMinInvocationsNonUniform & 0x1f) & 1) != 0)
    goto switchD_003c4cbb_caseD_11a;
    if ((0x7e00U >> (op - EOpMinInvocationsNonUniform & 0x1f) & 1) != 0)
    goto switchD_003c4cbb_caseD_120;
  case EOpMinInvocations:
  case EOpMaxInvocations:
  case EOpAddInvocations:
    bVar3 = false;
    local_98 = GroupOperationReduce;
    break;
  case EOpMinInvocationsInclusiveScan:
  case EOpMaxInvocationsInclusiveScan:
  case EOpAddInvocationsInclusiveScan:
switchD_003c4cbb_caseD_11a:
    local_98 = GroupOperationInclusiveScan;
    goto LAB_003c4d9e;
  case EOpMinInvocationsExclusiveScan:
  case EOpMaxInvocationsExclusiveScan:
  case EOpAddInvocationsExclusiveScan:
switchD_003c4cbb_caseD_120:
    local_98 = ExclusiveScan;
LAB_003c4d9e:
    bVar3 = false;
    break;
  default:
    local_98 = GroupOperationMax;
    bVar3 = true;
  }
  scope.word = spv::Builder::makeUintConstant(this_00,3,false);
  scope.isId = true;
  std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
            (&spvGroupOperands,&scope);
  if (!bVar3) {
    groupOp.isId = false;
    groupOp.word = local_98;
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
              (&spvGroupOperands,&groupOp);
  }
LAB_003c4b2c:
  uVar2 = typeProxy - EbtUint8;
  uVar6 = typeProxy - EbtFloat;
  for (puVar7 = (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar7 != (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish; puVar7 = puVar7 + 1) {
    scope.word = *puVar7;
    scope.isId = true;
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
              (&spvGroupOperands,&scope);
  }
  switch(op) {
  case EOpMinInvocations:
  case EOpMinInvocationsInclusiveScan:
  case EOpMinInvocationsExclusiveScan:
    OVar5 = OpGroupSMin - ((uVar2 & 0xfffffff9) == 0);
    opCode = OpGroupFMin;
    break;
  case EOpMaxInvocations:
  case EOpMaxInvocationsInclusiveScan:
  case EOpMaxInvocationsExclusiveScan:
    OVar5 = OpGroupSMax - ((uVar2 & 0xfffffff9) == 0);
    opCode = OpGroupFMax;
    break;
  case EOpAddInvocations:
  case EOpAddInvocationsInclusiveScan:
  case EOpAddInvocationsExclusiveScan:
    opCode = (uVar6 < 3) + OpGroupIAdd;
    goto LAB_003c4d5a;
  case EOpMinInvocationsNonUniform:
  case EOpMinInvocationsInclusiveScanNonUniform:
  case EOpMinInvocationsExclusiveScanNonUniform:
    OVar5 = OpGroupSMinNonUniformAMD - ((uVar2 & 0xfffffff9) == 0);
    opCode = OpGroupFMinNonUniformAMD;
    break;
  case EOpMaxInvocationsNonUniform:
  case EOpMaxInvocationsInclusiveScanNonUniform:
  case EOpMaxInvocationsExclusiveScanNonUniform:
    OVar5 = OpGroupSMaxNonUniformAMD - ((uVar2 & 0xfffffff9) == 0);
    opCode = OpGroupFMaxNonUniformAMD;
    break;
  case EOpAddInvocationsNonUniform:
  case EOpAddInvocationsInclusiveScanNonUniform:
  case EOpAddInvocationsExclusiveScanNonUniform:
    opCode = (uVar6 < 3) + OpGroupIAddNonUniformAMD;
    goto LAB_003c4d5a;
  default:
    if (uVar1 < 6) {
      IVar4 = (*(code *)(&DAT_00737ce0 + *(int *)(&DAT_00737ce0 + (ulong)uVar1 * 4)))();
      return IVar4;
    }
    this_01 = this->logger;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scope,"invocation operation",(allocator<char> *)&groupOp);
    spv::SpvBuildLogger::missingFunctionality(this_01,(string *)&scope);
    std::__cxx11::string::_M_dispose();
    IVar4 = 0;
    goto LAB_003c4e5e;
  }
  if (2 < uVar6) {
    opCode = OVar5;
  }
LAB_003c4d5a:
  if ((this->builder).module.idToInstruction.
      super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
      super__Vector_impl_data._M_start[typeId]->opCode == OpTypeVector) {
    IVar4 = CreateInvocationsVectorOperation(this,opCode,local_98,typeId,operands);
  }
  else {
    IVar4 = spv::Builder::createOp(&this->builder,opCode,typeId,&spvGroupOperands);
  }
LAB_003c4e5e:
  std::_Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::~_Vector_base
            (&spvGroupOperands.
              super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>);
  return IVar4;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createInvocationsOperation(glslang::TOperator op, spv::Id typeId,
    std::vector<spv::Id>& operands, glslang::TBasicType typeProxy)
{
    bool isUnsigned = isTypeUnsignedInt(typeProxy);
    bool isFloat = isTypeFloat(typeProxy);

    spv::Op opCode = spv::OpNop;
    std::vector<spv::IdImmediate> spvGroupOperands;
    spv::GroupOperation groupOperation = spv::GroupOperationMax;

    if (op == glslang::EOpBallot || op == glslang::EOpReadFirstInvocation ||
        op == glslang::EOpReadInvocation) {
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
    } else if (op == glslang::EOpAnyInvocation ||
        op == glslang::EOpAllInvocations ||
        op == glslang::EOpAllInvocationsEqual) {
        builder.addExtension(spv::E_SPV_KHR_subgroup_vote);
        builder.addCapability(spv::CapabilitySubgroupVoteKHR);
    } else {
        builder.addCapability(spv::CapabilityGroups);
        if (op == glslang::EOpMinInvocationsNonUniform ||
            op == glslang::EOpMaxInvocationsNonUniform ||
            op == glslang::EOpAddInvocationsNonUniform ||
            op == glslang::EOpMinInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpMaxInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpAddInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpMinInvocationsExclusiveScanNonUniform ||
            op == glslang::EOpMaxInvocationsExclusiveScanNonUniform ||
            op == glslang::EOpAddInvocationsExclusiveScanNonUniform)
            builder.addExtension(spv::E_SPV_AMD_shader_ballot);

        switch (op) {
        case glslang::EOpMinInvocations:
        case glslang::EOpMaxInvocations:
        case glslang::EOpAddInvocations:
        case glslang::EOpMinInvocationsNonUniform:
        case glslang::EOpMaxInvocationsNonUniform:
        case glslang::EOpAddInvocationsNonUniform:
            groupOperation = spv::GroupOperationReduce;
            break;
        case glslang::EOpMinInvocationsInclusiveScan:
        case glslang::EOpMaxInvocationsInclusiveScan:
        case glslang::EOpAddInvocationsInclusiveScan:
        case glslang::EOpMinInvocationsInclusiveScanNonUniform:
        case glslang::EOpMaxInvocationsInclusiveScanNonUniform:
        case glslang::EOpAddInvocationsInclusiveScanNonUniform:
            groupOperation = spv::GroupOperationInclusiveScan;
            break;
        case glslang::EOpMinInvocationsExclusiveScan:
        case glslang::EOpMaxInvocationsExclusiveScan:
        case glslang::EOpAddInvocationsExclusiveScan:
        case glslang::EOpMinInvocationsExclusiveScanNonUniform:
        case glslang::EOpMaxInvocationsExclusiveScanNonUniform:
        case glslang::EOpAddInvocationsExclusiveScanNonUniform:
            groupOperation = spv::GroupOperationExclusiveScan;
            break;
        default:
            break;
        }
        spv::IdImmediate scope = { true, builder.makeUintConstant(spv::ScopeSubgroup) };
        spvGroupOperands.push_back(scope);
        if (groupOperation != spv::GroupOperationMax) {
            spv::IdImmediate groupOp = { false, (unsigned)groupOperation };
            spvGroupOperands.push_back(groupOp);
        }
    }

    for (auto opIt = operands.begin(); opIt != operands.end(); ++opIt) {
        spv::IdImmediate op = { true, *opIt };
        spvGroupOperands.push_back(op);
    }

    switch (op) {
    case glslang::EOpAnyInvocation:
        opCode = spv::OpSubgroupAnyKHR;
        break;
    case glslang::EOpAllInvocations:
        opCode = spv::OpSubgroupAllKHR;
        break;
    case glslang::EOpAllInvocationsEqual:
        opCode = spv::OpSubgroupAllEqualKHR;
        break;
    case glslang::EOpReadInvocation:
        opCode = spv::OpSubgroupReadInvocationKHR;
        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);
        break;
    case glslang::EOpReadFirstInvocation:
        opCode = spv::OpSubgroupFirstInvocationKHR;
        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);
        break;
    case glslang::EOpBallot:
    {
        // NOTE: According to the spec, the result type of "OpSubgroupBallotKHR" must be a 4 component vector of 32
        // bit integer types. The GLSL built-in function "ballotARB()" assumes the maximum number of invocations in
        // a subgroup is 64. Thus, we have to convert uvec4.xy to uint64_t as follow:
        //
        //     result = Bitcast(SubgroupBallotKHR(Predicate).xy)
        //
        spv::Id uintType  = builder.makeUintType(32);
        spv::Id uvec4Type = builder.makeVectorType(uintType, 4);
        spv::Id result = builder.createOp(spv::OpSubgroupBallotKHR, uvec4Type, spvGroupOperands);

        std::vector<spv::Id> components;
        components.push_back(builder.createCompositeExtract(result, uintType, 0));
        components.push_back(builder.createCompositeExtract(result, uintType, 1));

        spv::Id uvec2Type = builder.makeVectorType(uintType, 2);
        return builder.createUnaryOp(spv::OpBitcast, typeId,
                                     builder.createCompositeConstruct(uvec2Type, components));
    }

    case glslang::EOpMinInvocations:
    case glslang::EOpMaxInvocations:
    case glslang::EOpAddInvocations:
    case glslang::EOpMinInvocationsInclusiveScan:
    case glslang::EOpMaxInvocationsInclusiveScan:
    case glslang::EOpAddInvocationsInclusiveScan:
    case glslang::EOpMinInvocationsExclusiveScan:
    case glslang::EOpMaxInvocationsExclusiveScan:
    case glslang::EOpAddInvocationsExclusiveScan:
        if (op == glslang::EOpMinInvocations ||
            op == glslang::EOpMinInvocationsInclusiveScan ||
            op == glslang::EOpMinInvocationsExclusiveScan) {
            if (isFloat)
                opCode = spv::OpGroupFMin;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMin;
                else
                    opCode = spv::OpGroupSMin;
            }
        } else if (op == glslang::EOpMaxInvocations ||
                   op == glslang::EOpMaxInvocationsInclusiveScan ||
                   op == glslang::EOpMaxInvocationsExclusiveScan) {
            if (isFloat)
                opCode = spv::OpGroupFMax;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMax;
                else
                    opCode = spv::OpGroupSMax;
            }
        } else {
            if (isFloat)
                opCode = spv::OpGroupFAdd;
            else
                opCode = spv::OpGroupIAdd;
        }

        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);

        break;
    case glslang::EOpMinInvocationsNonUniform:
    case glslang::EOpMaxInvocationsNonUniform:
    case glslang::EOpAddInvocationsNonUniform:
    case glslang::EOpMinInvocationsInclusiveScanNonUniform:
    case glslang::EOpMaxInvocationsInclusiveScanNonUniform:
    case glslang::EOpAddInvocationsInclusiveScanNonUniform:
    case glslang::EOpMinInvocationsExclusiveScanNonUniform:
    case glslang::EOpMaxInvocationsExclusiveScanNonUniform:
    case glslang::EOpAddInvocationsExclusiveScanNonUniform:
        if (op == glslang::EOpMinInvocationsNonUniform ||
            op == glslang::EOpMinInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpMinInvocationsExclusiveScanNonUniform) {
            if (isFloat)
                opCode = spv::OpGroupFMinNonUniformAMD;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMinNonUniformAMD;
                else
                    opCode = spv::OpGroupSMinNonUniformAMD;
            }
        }
        else if (op == glslang::EOpMaxInvocationsNonUniform ||
                 op == glslang::EOpMaxInvocationsInclusiveScanNonUniform ||
                 op == glslang::EOpMaxInvocationsExclusiveScanNonUniform) {
            if (isFloat)
                opCode = spv::OpGroupFMaxNonUniformAMD;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMaxNonUniformAMD;
                else
                    opCode = spv::OpGroupSMaxNonUniformAMD;
            }
        }
        else {
            if (isFloat)
                opCode = spv::OpGroupFAddNonUniformAMD;
            else
                opCode = spv::OpGroupIAddNonUniformAMD;
        }

        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);

        break;
    default:
        logger->missingFunctionality("invocation operation");
        return spv::NoResult;
    }

    assert(opCode != spv::OpNop);
    return builder.createOp(opCode, typeId, spvGroupOperands);
}